

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O0

void __thiscall glslang::TIntermLoop::traverse(TIntermLoop *this,TIntermTraverser *it)

{
  int iVar1;
  byte local_19;
  bool visit;
  TIntermTraverser *it_local;
  TIntermLoop *this_local;
  
  local_19 = 1;
  if ((it->preVisit & 1U) != 0) {
    iVar1 = (*it->_vptr_TIntermTraverser[8])(it,0,this);
    local_19 = (byte)iVar1 & 1;
  }
  if (local_19 != 0) {
    TIntermTraverser::incrementDepth(it,&this->super_TIntermNode);
    if ((it->rightToLeft & 1U) == 0) {
      if (this->test != (TIntermTyped *)0x0) {
        (*(this->test->super_TIntermNode)._vptr_TIntermNode[2])(this->test,it);
      }
      if (this->body != (TIntermNode *)0x0) {
        (*this->body->_vptr_TIntermNode[2])(this->body,it);
      }
      if (this->terminal != (TIntermTyped *)0x0) {
        (*(this->terminal->super_TIntermNode)._vptr_TIntermNode[2])(this->terminal,it);
      }
    }
    else {
      if (this->terminal != (TIntermTyped *)0x0) {
        (*(this->terminal->super_TIntermNode)._vptr_TIntermNode[2])(this->terminal,it);
      }
      if (this->body != (TIntermNode *)0x0) {
        (*this->body->_vptr_TIntermNode[2])(this->body,it);
      }
      if (this->test != (TIntermTyped *)0x0) {
        (*(this->test->super_TIntermNode)._vptr_TIntermNode[2])(this->test,it);
      }
    }
    TIntermTraverser::decrementDepth(it);
  }
  if ((local_19 != 0) && ((it->postVisit & 1U) != 0)) {
    (*it->_vptr_TIntermTraverser[8])(it,2,this);
  }
  return;
}

Assistant:

void TIntermLoop::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitLoop(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);

        if (it->rightToLeft) {
            if (terminal)
                terminal->traverse(it);

            if (body)
                body->traverse(it);

            if (test)
                test->traverse(it);
        } else {
            if (test)
                test->traverse(it);

            if (body)
                body->traverse(it);

            if (terminal)
                terminal->traverse(it);
        }

        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitLoop(EvPostVisit, this);
}